

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::pipe_terminated(session_base_t *this,pipe_t *pipe_)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<zmq::pipe_t_*>,_std::_Rb_tree_iterator<zmq::pipe_t_*>_> pVar5;
  pipe_t *local_18;
  
  local_18 = pipe_;
  if ((this->_pipe != pipe_) && (this->_zap_pipe != pipe_)) {
    p_Var1 = &(this->_terminating_pipes)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->_terminating_pipes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(pipe_t **)(p_Var4 + 1) < pipe_])
    {
      if (*(pipe_t **)(p_Var4 + 1) >= pipe_) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, pipe_ < *(pipe_t **)(p_Var3 + 1))
       ) {
      p_Var4 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      pipe_terminated();
    }
  }
  if (local_18 == this->_pipe) {
    this->_pipe = (pipe_t *)0x0;
    if (this->_has_linger_timer == true) {
      io_object_t::cancel_timer(&this->super_io_object_t,0x20);
      this->_has_linger_timer = false;
    }
  }
  else if (local_18 == this->_zap_pipe) {
    this->_zap_pipe = (pipe_t *)0x0;
  }
  else {
    pVar5 = std::
            _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
            ::equal_range(&(this->_terminating_pipes)._M_t,&local_18);
    std::
    _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
    ::_M_erase_aux(&(this->_terminating_pipes)._M_t,(_Base_ptr)pVar5.first._M_node,
                   (_Base_ptr)pVar5.second._M_node);
  }
  bVar2 = own_t::is_terminating(&this->super_own_t);
  if ((!bVar2) && ((this->super_own_t).options.raw_socket == true)) {
    if (this->_engine != (i_engine *)0x0) {
      (*this->_engine->_vptr_i_engine[4])();
      this->_engine = (i_engine *)0x0;
    }
    own_t::terminate(&this->super_own_t);
  }
  if ((((this->_pending == true) && (this->_pipe == (pipe_t *)0x0)) &&
      (this->_zap_pipe == (pipe_t *)0x0)) &&
     ((this->_terminating_pipes)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    this->_pending = false;
    own_t::process_term(&this->super_own_t,0);
  }
  return;
}

Assistant:

void zmq::session_base_t::pipe_terminated (pipe_t *pipe_)
{
    // Drop the reference to the deallocated pipe if required.
    zmq_assert (pipe_ == _pipe || pipe_ == _zap_pipe
                || _terminating_pipes.count (pipe_) == 1);

    if (pipe_ == _pipe) {
        // If this is our current pipe, remove it
        _pipe = NULL;
        if (_has_linger_timer) {
            cancel_timer (linger_timer_id);
            _has_linger_timer = false;
        }
    } else if (pipe_ == _zap_pipe)
        _zap_pipe = NULL;
    else
        // Remove the pipe from the detached pipes set
        _terminating_pipes.erase (pipe_);

    if (!is_terminating () && options.raw_socket) {
        if (_engine) {
            _engine->terminate ();
            _engine = NULL;
        }
        terminate ();
    }

    //  If we are waiting for pending messages to be sent, at this point
    //  we are sure that there will be no more messages and we can proceed
    //  with termination safely.
    if (_pending && !_pipe && !_zap_pipe && _terminating_pipes.empty ()) {
        _pending = false;
        own_t::process_term (0);
    }
}